

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyHashInsert(SyHash *pHash,void *pKey,sxu32 nKeyLen,void *pUserData)

{
  SyHashEntry_Pr *pSVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  SyHashEntry_Pr **ppSVar4;
  SyHashEntry_Pr **ppSVar5;
  SyHashEntry_Pr *pSVar6;
  sxu32 sVar7;
  uint uVar8;
  bool bVar9;
  
  sVar2 = pHash->nBucketSize;
  if (sVar2 * 3 <= pHash->nEntry) {
    ppSVar4 = (SyHashEntry_Pr **)SyMemBackendAlloc(pHash->pAllocator,sVar2 << 4);
    if (ppSVar4 != (SyHashEntry_Pr **)0x0) {
      SyZero(ppSVar4,sVar2 << 4);
      ppSVar5 = &pHash->pList;
      sVar7 = pHash->nEntry;
      while (bVar9 = sVar7 != 0, sVar7 = sVar7 - 1, bVar9) {
        pSVar6 = *ppSVar5;
        pSVar6->pNextCollide = (SyHashEntry_Pr *)0x0;
        pSVar6->pPrevCollide = (SyHashEntry_Pr *)0x0;
        uVar8 = pSVar6->nHash & sVar2 * 2 - 1;
        pSVar1 = ppSVar4[uVar8];
        pSVar6->pNextCollide = pSVar1;
        if (pSVar1 != (SyHashEntry_Pr *)0x0) {
          pSVar1->pPrevCollide = pSVar6;
        }
        ppSVar4[uVar8] = pSVar6;
        ppSVar5 = &pSVar6->pNext;
      }
      SyMemBackendFree(pHash->pAllocator,pHash->apBucket);
      pHash->apBucket = ppSVar4;
      pHash->nBucketSize = sVar2 * 2;
    }
  }
  pSVar6 = (SyHashEntry_Pr *)SyMemBackendPoolAlloc(pHash->pAllocator,0x48);
  if (pSVar6 == (SyHashEntry_Pr *)0x0) {
    sVar3 = -1;
  }
  else {
    SyZero(pSVar6,0x48);
    pSVar6->pHash = pHash;
    pSVar6->pKey = pKey;
    pSVar6->nKeyLen = nKeyLen;
    pSVar6->pUserData = pUserData;
    sVar2 = (*pHash->xHash)(pKey,nKeyLen);
    pSVar6->nHash = sVar2;
    uVar8 = pHash->nBucketSize - 1 & sVar2;
    ppSVar4 = pHash->apBucket;
    pSVar1 = ppSVar4[uVar8];
    pSVar6->pNextCollide = pSVar1;
    if (pSVar1 != (SyHashEntry_Pr *)0x0) {
      pSVar1->pPrevCollide = pSVar6;
    }
    ppSVar4[uVar8] = pSVar6;
    pSVar1 = pHash->pList;
    if (pSVar1 != (SyHashEntry_Pr *)0x0) {
      pSVar6->pNext = pSVar1;
      pSVar1->pPrev = pSVar6;
    }
    pHash->pList = pSVar6;
    if (pHash->nEntry == 0) {
      pHash->pCurrent = pSVar6;
    }
    pHash->nEntry = pHash->nEntry + 1;
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyHashInsert(SyHash *pHash, const void *pKey, sxu32 nKeyLen, void *pUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) || pKey == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	if( pHash->nEntry >= pHash->nBucketSize * SXHASH_FILL_FACTOR ){
		rc = HashGrowTable(&(*pHash));
		if( rc != SXRET_OK ){
			return rc;
		}
	}
	/* Allocate a new hash entry */
	pEntry = (SyHashEntry_Pr *)SyMemBackendPoolAlloc(pHash->pAllocator, sizeof(SyHashEntry_Pr));
	if( pEntry == 0 ){
		return SXERR_MEM;
	}
	/* Zero the entry */
	SyZero(pEntry, sizeof(SyHashEntry_Pr));
	pEntry->pHash = pHash;
	pEntry->pKey = pKey;
	pEntry->nKeyLen = nKeyLen;
	pEntry->pUserData = pUserData;
	pEntry->nHash = pHash->xHash(pEntry->pKey, pEntry->nKeyLen);
	/* Finally insert the entry in its corresponding bucket */
	rc = HashInsert(&(*pHash), pEntry);
	return rc;
}